

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool Hacl_Impl_P256_DH_ecp256dh_r
                (uint8_t *shared_secret,uint8_t *their_pubkey,uint8_t *private_key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  _Bool _Var87;
  uint64_t uVar88;
  uint64_t uVar89;
  uint64_t uVar90;
  uint64_t uVar91;
  uint64_t uVar92;
  uint64_t uVar93;
  uint64_t uVar94;
  uint64_t uVar95;
  long lVar96;
  long lVar97;
  uint32_t i;
  ulong uVar98;
  uint64_t *puVar99;
  uint64_t *puVar100;
  undefined8 *puVar101;
  uint64_t *puVar102;
  undefined8 *puVar103;
  uint64_t *t11_1;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  uint64_t *t11;
  ulong uVar107;
  ulong uVar108;
  byte bVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [16];
  undefined1 local_d48 [16];
  undefined1 local_d38 [16];
  undefined1 local_d28 [16];
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  uint64_t local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  uint64_t local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  uint64_t local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  uint64_t local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  uint64_t local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  uint64_t local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  uint64_t local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  uint64_t local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  uint64_t local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  uint64_t local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  uint64_t local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  uint64_t local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  uint64_t local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  uint64_t local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  uint64_t local_788;
  undefined8 uStack_780;
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  uint64_t tmp [16];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  uint64_t local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  uint64_t local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  uint64_t local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  uint64_t local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  uint64_t local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  uint64_t local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  uint64_t local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  uint64_t local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint64_t local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  uint64_t local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint64_t local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  uint64_t local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  uint64_t local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  uint64_t local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint64_t local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint64_t tmp_1 [12];
  
  bVar109 = 0;
  tmp[0xe] = 0;
  tmp[0xf] = 0;
  tmp[0xc] = 0;
  tmp[0xd] = 0;
  tmp[10] = 0;
  tmp[0xb] = 0;
  tmp[8] = 0;
  tmp[9] = 0;
  tmp[6] = 0;
  tmp[7] = 0;
  tmp[4] = 0;
  tmp[5] = 0;
  tmp[2] = 0;
  tmp[3] = 0;
  tmp[0] = 0;
  tmp[1] = 0;
  _Var87 = load_point_vartime(tmp + 4,their_pubkey);
  uVar98 = *(ulong *)(private_key + 0x18);
  uVar107 = uVar98 >> 0x38 | (uVar98 & 0xff000000000000) >> 0x28 | (uVar98 & 0xff0000000000) >> 0x18
            | (uVar98 & 0xff00000000) >> 8 | (uVar98 & 0xff000000) << 8 |
            (uVar98 & 0xff0000) << 0x18 | (uVar98 & 0xff00) << 0x28 | uVar98 << 0x38;
  uVar98 = *(ulong *)(private_key + 0x10);
  uVar104 = uVar98 >> 0x38 | (uVar98 & 0xff000000000000) >> 0x28 | (uVar98 & 0xff0000000000) >> 0x18
            | (uVar98 & 0xff00000000) >> 8 | (uVar98 & 0xff000000) << 8 |
            (uVar98 & 0xff0000) << 0x18 | (uVar98 & 0xff00) << 0x28 | uVar98 << 0x38;
  uVar98 = *(ulong *)(private_key + 8);
  uVar105 = uVar98 >> 0x38 | (uVar98 & 0xff000000000000) >> 0x28 | (uVar98 & 0xff0000000000) >> 0x18
            | (uVar98 & 0xff00000000) >> 8 | (uVar98 & 0xff000000) << 8 |
            (uVar98 & 0xff0000) << 0x18 | (uVar98 & 0xff00) << 0x28 | uVar98 << 0x38;
  uVar98 = *(ulong *)private_key;
  uVar98 = uVar98 >> 0x38 | (uVar98 & 0xff000000000000) >> 0x28 | (uVar98 & 0xff0000000000) >> 0x18
           | (uVar98 & 0xff00000000) >> 8 | (uVar98 & 0xff000000) << 8 | (uVar98 & 0xff0000) << 0x18
           | (uVar98 & 0xff00) << 0x28 | uVar98 << 0x38;
  tmp[0] = uVar107;
  tmp[1] = uVar104;
  tmp[2] = uVar105;
  tmp[3] = uVar98;
  uVar88 = bn_is_lt_order_and_gt_zero_mask4(tmp);
  tmp[1] = uVar104 & uVar88;
  tmp[0] = (uVar107 ^ 1) & uVar88 ^ 1;
  tmp[3] = uVar98 & uVar88;
  tmp[2] = uVar105 & uVar88;
  if (_Var87) {
    memset(&local_5d8,0,0x540);
    tmp_1[10] = 0;
    tmp_1[0xb] = 0;
    tmp_1[8] = 0;
    tmp_1[9] = 0;
    tmp_1[6] = 0;
    tmp_1[7] = 0;
    tmp_1[4] = 0;
    tmp_1[5] = 0;
    tmp_1[2] = 0;
    tmp_1[3] = 0;
    tmp_1[0] = 0;
    tmp_1[1] = 0;
    local_698 = (undefined1  [16])0x0;
    local_688 = (undefined1  [16])0x0;
    local_678 = 1;
    local_670 = 0xffffffff00000000;
    local_668 = 0xffffffffffffffff;
    local_660 = 0xfffffffe;
    local_658 = (undefined1  [16])0x0;
    local_648 = (undefined1  [16])0x0;
    puVar100 = tmp + 4;
    lVar97 = 0xc;
    puVar99 = puVar100;
    puVar102 = &local_638;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_638);
    puVar99 = tmp_1;
    puVar102 = &local_5d8;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_5d8);
    puVar99 = tmp_1;
    puVar102 = &local_578;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_5d8);
    puVar99 = tmp_1;
    puVar102 = &local_518;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_518);
    puVar99 = tmp_1;
    puVar102 = &local_4b8;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_578);
    puVar99 = tmp_1;
    puVar102 = &local_458;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_458);
    puVar99 = tmp_1;
    puVar102 = &local_3f8;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_518);
    puVar99 = tmp_1;
    puVar102 = &local_398;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_398);
    puVar99 = tmp_1;
    puVar102 = &local_338;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_4b8);
    puVar99 = tmp_1;
    puVar102 = &local_2d8;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_2d8);
    puVar99 = tmp_1;
    puVar102 = &local_278;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_458);
    puVar99 = tmp_1;
    puVar102 = &local_218;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_218);
    puVar99 = tmp_1;
    puVar102 = &local_1b8;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_double(tmp_1,&local_3f8);
    puVar99 = tmp_1;
    puVar102 = &local_158;
    for (lVar96 = lVar97; lVar96 != 0; lVar96 = lVar96 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar109 * -2 + 1;
    }
    point_add(tmp_1,puVar100,&local_158);
    puVar100 = tmp_1;
    puVar99 = &local_f8;
    for (; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar99 = *puVar100;
      puVar100 = puVar100 + (ulong)bVar109 * -2 + 1;
      puVar99 = puVar99 + (ulong)bVar109 * -2 + 1;
    }
    local_768 = (undefined1  [16])0x0;
    local_778 = (undefined1  [16])0x0;
    local_758 = 1;
    local_750 = 0xffffffff00000000;
    local_748 = 0xffffffffffffffff;
    local_740 = 0xfffffffe;
    local_738 = (undefined1  [16])0x0;
    local_728 = (undefined1  [16])0x0;
    local_788 = local_638;
    uStack_780 = uStack_630;
    local_798 = local_628;
    uStack_790 = uStack_620;
    local_7a8 = local_618;
    uStack_7a0 = uStack_610;
    local_7b8 = local_608;
    uStack_7b0 = uStack_600;
    local_7c8 = local_5c8;
    uStack_7c0 = uStack_5c0;
    local_7d8 = local_5d8;
    uStack_7d0 = uStack_5d0;
    local_7e8 = local_568;
    uStack_7e0 = uStack_560;
    local_7f8 = local_578;
    uStack_7f0 = uStack_570;
    local_808 = local_5a8;
    uStack_800 = uStack_5a0;
    local_818 = local_5b8;
    uStack_810 = uStack_5b0;
    local_828 = local_548;
    uStack_820 = uStack_540;
    local_838 = local_558;
    uStack_830 = uStack_550;
    local_848 = local_5e8;
    uStack_840 = uStack_5e0;
    local_858 = local_5f8;
    uStack_850 = uStack_5f0;
    local_868 = local_588;
    uStack_860 = uStack_580;
    local_878 = local_598;
    uStack_870 = uStack_590;
    local_888 = local_508;
    uStack_880 = uStack_500;
    local_898 = local_518;
    uStack_890 = uStack_510;
    local_8a8 = local_4e8;
    uStack_8a0 = uStack_4e0;
    local_8b8 = local_4f8;
    uStack_8b0 = uStack_4f0;
    local_8c8 = local_528;
    uStack_8c0 = uStack_520;
    local_8d8 = local_538;
    uStack_8d0 = uStack_530;
    local_8e8 = local_4c8;
    uStack_8e0 = uStack_4c0;
    local_8f8 = local_4d8;
    uStack_8f0 = uStack_4d0;
    local_908 = local_4a8;
    uStack_900 = uStack_4a0;
    local_918 = local_4b8;
    uStack_910 = uStack_4b0;
    local_928 = local_488;
    uStack_920 = uStack_480;
    local_938 = local_498;
    uStack_930 = uStack_490;
    local_948 = local_448;
    uStack_940 = uStack_440;
    local_958 = local_458;
    uStack_950 = uStack_450;
    local_968 = local_428;
    uStack_960 = uStack_420;
    local_978 = local_438;
    uStack_970 = uStack_430;
    local_988 = local_468;
    uStack_980 = uStack_460;
    local_998 = local_478;
    uStack_990 = uStack_470;
    local_9a8 = local_3e8;
    uStack_9a0 = uStack_3e0;
    local_9b8 = local_3f8;
    uStack_9b0 = uStack_3f0;
    local_9c8 = local_3c8;
    uStack_9c0 = uStack_3c0;
    local_9d8 = local_3d8;
    uStack_9d0 = uStack_3d0;
    local_9e8 = local_408;
    uStack_9e0 = uStack_400;
    local_9f8 = local_418;
    uStack_9f0 = uStack_410;
    local_a08 = local_388;
    uStack_a00 = uStack_380;
    local_a18 = local_398;
    uStack_a10 = uStack_390;
    local_a28 = local_368;
    uStack_a20 = uStack_360;
    local_a38 = local_378;
    uStack_a30 = uStack_370;
    local_a48 = local_3a8;
    uStack_a40 = uStack_3a0;
    local_a58 = local_3b8;
    uStack_a50 = uStack_3b0;
    local_a68 = local_328;
    uStack_a60 = uStack_320;
    local_a78 = local_338;
    uStack_a70 = uStack_330;
    local_a88 = local_308;
    uStack_a80 = uStack_300;
    local_a98 = local_318;
    uStack_a90 = uStack_310;
    local_aa8 = local_348;
    uStack_aa0 = uStack_340;
    local_ab8 = local_358;
    uStack_ab0 = uStack_350;
    local_ac8 = local_2e8;
    uStack_ac0 = uStack_2e0;
    local_ad8 = local_2f8;
    uStack_ad0 = uStack_2f0;
    local_ae8 = local_2c8;
    uStack_ae0 = uStack_2c0;
    local_af8 = local_2d8;
    uStack_af0 = uStack_2d0;
    local_b08 = local_2a8;
    uStack_b00 = uStack_2a0;
    local_b18 = local_2b8;
    uStack_b10 = uStack_2b0;
    local_b28 = local_288;
    uStack_b20 = uStack_280;
    local_b38 = local_298;
    uStack_b30 = uStack_290;
    local_b48 = local_268;
    uStack_b40 = uStack_260;
    local_b58 = local_278;
    uStack_b50 = uStack_270;
    local_b68 = local_248;
    uStack_b60 = uStack_240;
    local_b78 = local_258;
    uStack_b70 = uStack_250;
    local_b88 = local_208;
    uStack_b80 = uStack_200;
    local_b98 = local_218;
    uStack_b90 = uStack_210;
    local_ba8 = local_1e8;
    uStack_ba0 = uStack_1e0;
    local_bb8 = local_1f8;
    uStack_bb0 = uStack_1f0;
    local_bc8 = local_228;
    uStack_bc0 = uStack_220;
    local_bd8 = local_238;
    uStack_bd0 = uStack_230;
    local_be8 = local_1a8;
    uStack_be0 = uStack_1a0;
    local_bf8 = local_1b8;
    uStack_bf0 = uStack_1b0;
    local_c08 = local_188;
    uStack_c00 = uStack_180;
    local_c18 = local_198;
    uStack_c10 = uStack_190;
    local_c28 = local_1c8;
    uStack_c20 = uStack_1c0;
    local_c38 = local_1d8;
    uStack_c30 = uStack_1d0;
    local_c48 = local_148;
    uStack_c40 = uStack_140;
    local_c58 = local_158;
    uStack_c50 = uStack_150;
    local_c68 = local_e8;
    uStack_c60 = uStack_e0;
    local_c78 = local_f8;
    uStack_c70 = uStack_f0;
    local_c88 = local_128;
    uStack_c80 = uStack_120;
    local_c98 = local_138;
    uStack_c90 = uStack_130;
    local_ca8 = local_c8;
    uStack_ca0 = uStack_c0;
    local_cb8 = local_d8;
    uStack_cb0 = uStack_d0;
    local_cc8 = local_168;
    uStack_cc0 = uStack_160;
    local_cd8 = local_178;
    uStack_cd0 = uStack_170;
    local_ce8 = local_108;
    uStack_ce0 = uStack_100;
    local_cf8 = local_118;
    uStack_cf0 = uStack_110;
    local_d08 = local_a8;
    uStack_d00 = uStack_a0;
    local_d18 = local_b8;
    uStack_d10 = uStack_b0;
    for (i = 0xfc; i != 0xfffffffc; i = i - 4) {
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      uVar89 = Hacl_Bignum_Lib_bn_get_bits_u64(4,tmp,i,4);
      puVar101 = (undefined8 *)local_698;
      puVar103 = (undefined8 *)local_d78;
      for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
        *puVar103 = *puVar101;
        puVar101 = puVar101 + (ulong)bVar109 * -2 + 1;
        puVar103 = puVar103 + (ulong)bVar109 * -2 + 1;
      }
      uVar90 = FStar_UInt64_eq_mask(uVar89,1);
      uVar105 = ~uVar90;
      uVar91 = FStar_UInt64_eq_mask(uVar89,2);
      uVar107 = ~uVar91;
      uVar92 = FStar_UInt64_eq_mask(uVar89,3);
      uVar104 = ~uVar92;
      uVar93 = FStar_UInt64_eq_mask(uVar89,4);
      uVar98 = ~uVar93;
      auVar113._8_4_ = (int)uVar90;
      auVar113._0_8_ = uVar90;
      auVar113._12_4_ = (int)(uVar90 >> 0x20);
      auVar85._8_8_ = uStack_790;
      auVar85._0_8_ = local_798;
      auVar86._8_8_ = uStack_780;
      auVar86._0_8_ = local_788;
      auVar143._8_4_ = (int)uVar105;
      auVar143._0_8_ = uVar105;
      auVar143._12_4_ = (int)(uVar105 >> 0x20);
      auVar137 = local_d68 & auVar143;
      auVar133 = local_d78 & auVar143;
      auVar119._8_4_ = (int)uVar91;
      auVar119._0_8_ = uVar91;
      auVar119._12_4_ = (int)(uVar91 >> 0x20);
      auVar82._8_8_ = uStack_7c0;
      auVar82._0_8_ = local_7c8;
      auVar81._8_8_ = uStack_7d0;
      auVar81._0_8_ = local_7d8;
      auVar128._8_4_ = (int)uVar107;
      auVar128._0_8_ = uVar107;
      auVar128._12_4_ = (int)(uVar107 >> 0x20);
      auVar116._8_4_ = (int)uVar92;
      auVar116._0_8_ = uVar92;
      auVar116._12_4_ = (int)(uVar92 >> 0x20);
      auVar80._8_8_ = uStack_7e0;
      auVar80._0_8_ = local_7e8;
      auVar79._8_8_ = uStack_7f0;
      auVar79._0_8_ = local_7f8;
      auVar125._8_4_ = (int)uVar104;
      auVar125._0_8_ = uVar104;
      auVar125._12_4_ = (int)(uVar104 >> 0x20);
      auVar110._8_4_ = (int)uVar93;
      auVar110._0_8_ = uVar93;
      auVar110._12_4_ = (int)(uVar93 >> 0x20);
      auVar70._8_8_ = uStack_880;
      auVar70._0_8_ = local_888;
      auVar69._8_8_ = uStack_890;
      auVar69._0_8_ = local_898;
      auVar122._8_4_ = (int)uVar98;
      auVar122._0_8_ = uVar98;
      auVar122._12_4_ = (int)(uVar98 >> 0x20);
      auVar83._8_8_ = uStack_7b0;
      auVar83._0_8_ = local_7b8;
      auVar84._8_8_ = uStack_7a0;
      auVar84._0_8_ = local_7a8;
      auVar138 = local_d48 & auVar143;
      auVar141 = local_d58 & auVar143;
      auVar78._8_8_ = uStack_800;
      auVar78._0_8_ = local_808;
      auVar77._8_8_ = uStack_810;
      auVar77._0_8_ = local_818;
      auVar76._8_8_ = uStack_820;
      auVar76._0_8_ = local_828;
      auVar75._8_8_ = uStack_830;
      auVar75._0_8_ = local_838;
      auVar68._8_8_ = uStack_8a0;
      auVar68._0_8_ = local_8a8;
      auVar67._8_8_ = uStack_8b0;
      auVar67._0_8_ = local_8b8;
      auVar74._8_8_ = uStack_840;
      auVar74._0_8_ = local_848;
      auVar134 = local_d28 & auVar143;
      auVar73._8_8_ = uStack_850;
      auVar73._0_8_ = local_858;
      auVar143 = auVar143 & local_d38;
      auVar72._8_8_ = uStack_860;
      auVar72._0_8_ = local_868;
      auVar71._8_8_ = uStack_870;
      auVar71._0_8_ = local_878;
      auVar66._8_8_ = uStack_8c0;
      auVar66._0_8_ = local_8c8;
      auVar65._8_8_ = uStack_8d0;
      auVar65._0_8_ = local_8d8;
      auVar64._8_8_ = uStack_8e0;
      auVar64._0_8_ = local_8e8;
      auVar63._8_8_ = uStack_8f0;
      auVar63._0_8_ = local_8f8;
      uVar90 = FStar_UInt64_eq_mask(uVar89,5);
      uVar106 = ~uVar90;
      uVar91 = FStar_UInt64_eq_mask(uVar89,6);
      uVar107 = ~uVar91;
      uVar92 = FStar_UInt64_eq_mask(uVar89,7);
      uVar108 = ~uVar92;
      uVar93 = FStar_UInt64_eq_mask(uVar89,8);
      uVar105 = ~uVar93;
      uVar94 = FStar_UInt64_eq_mask(uVar89,9);
      uVar104 = ~uVar94;
      uVar95 = FStar_UInt64_eq_mask(uVar89,10);
      uVar98 = ~uVar95;
      auVar111._8_4_ = (int)uVar95;
      auVar111._0_8_ = uVar95;
      auVar111._12_4_ = (int)(uVar95 >> 0x20);
      auVar32._8_8_ = uStack_ae0;
      auVar32._0_8_ = local_ae8;
      auVar114._8_4_ = (int)uVar90;
      auVar114._0_8_ = uVar90;
      auVar114._12_4_ = (int)(uVar90 >> 0x20);
      auVar62._8_8_ = uStack_900;
      auVar62._0_8_ = local_908;
      auVar61._8_8_ = uStack_910;
      auVar61._0_8_ = local_918;
      auVar123._8_4_ = (int)uVar106;
      auVar123._0_8_ = uVar106;
      auVar123._12_4_ = (int)(uVar106 >> 0x20);
      auVar117._8_4_ = (int)uVar91;
      auVar117._0_8_ = uVar91;
      auVar117._12_4_ = (int)(uVar91 >> 0x20);
      auVar58._8_8_ = uStack_940;
      auVar58._0_8_ = local_948;
      auVar57._8_8_ = uStack_950;
      auVar57._0_8_ = local_958;
      auVar129._8_4_ = (int)uVar107;
      auVar129._0_8_ = uVar107;
      auVar129._12_4_ = (int)(uVar107 >> 0x20);
      auVar120._8_4_ = (int)uVar92;
      auVar120._0_8_ = uVar92;
      auVar120._12_4_ = (int)(uVar92 >> 0x20);
      auVar52._8_8_ = uStack_9a0;
      auVar52._0_8_ = local_9a8;
      auVar51._8_8_ = uStack_9b0;
      auVar51._0_8_ = local_9b8;
      auVar135._8_4_ = (int)uVar108;
      auVar135._0_8_ = uVar108;
      auVar135._12_4_ = (int)(uVar108 >> 0x20);
      auVar126._8_4_ = (int)uVar93;
      auVar126._0_8_ = uVar93;
      auVar126._12_4_ = (int)(uVar93 >> 0x20);
      auVar46._8_8_ = uStack_a00;
      auVar46._0_8_ = local_a08;
      auVar45._8_8_ = uStack_a10;
      auVar45._0_8_ = local_a18;
      auVar139._8_4_ = (int)uVar105;
      auVar139._0_8_ = uVar105;
      auVar139._12_4_ = (int)(uVar105 >> 0x20);
      auVar131._8_4_ = (int)uVar94;
      auVar131._0_8_ = uVar94;
      auVar131._12_4_ = (int)(uVar94 >> 0x20);
      auVar40._8_8_ = uStack_a60;
      auVar40._0_8_ = local_a68;
      auVar142._8_4_ = (int)uVar104;
      auVar142._0_8_ = uVar104;
      auVar142._12_4_ = (int)(uVar104 >> 0x20);
      auVar39._8_8_ = uStack_a70;
      auVar39._0_8_ = local_a78;
      auVar144._8_4_ = (int)uVar98;
      auVar144._0_8_ = uVar98;
      auVar144._12_4_ = (int)(uVar98 >> 0x20);
      auVar31._8_8_ = uStack_af0;
      auVar31._0_8_ = local_af8;
      auVar60._8_8_ = uStack_920;
      auVar60._0_8_ = local_928;
      auVar59._8_8_ = uStack_930;
      auVar59._0_8_ = local_938;
      auVar56._8_8_ = uStack_960;
      auVar56._0_8_ = local_968;
      auVar55._8_8_ = uStack_970;
      auVar55._0_8_ = local_978;
      auVar50._8_8_ = uStack_9c0;
      auVar50._0_8_ = local_9c8;
      auVar49._8_8_ = uStack_9d0;
      auVar49._0_8_ = local_9d8;
      auVar44._8_8_ = uStack_a20;
      auVar44._0_8_ = local_a28;
      auVar43._8_8_ = uStack_a30;
      auVar43._0_8_ = local_a38;
      auVar38._8_8_ = uStack_a80;
      auVar38._0_8_ = local_a88;
      auVar37._8_8_ = uStack_a90;
      auVar37._0_8_ = local_a98;
      auVar30._8_8_ = uStack_b00;
      auVar30._0_8_ = local_b08;
      auVar29._8_8_ = uStack_b10;
      auVar29._0_8_ = local_b18;
      auVar54._8_8_ = uStack_980;
      auVar54._0_8_ = local_988;
      auVar53._8_8_ = uStack_990;
      auVar53._0_8_ = local_998;
      auVar48._8_8_ = uStack_9e0;
      auVar48._0_8_ = local_9e8;
      auVar47._8_8_ = uStack_9f0;
      auVar47._0_8_ = local_9f8;
      auVar42._8_8_ = uStack_a40;
      auVar42._0_8_ = local_a48;
      auVar41._8_8_ = uStack_a50;
      auVar41._0_8_ = local_a58;
      auVar36._8_8_ = uStack_aa0;
      auVar36._0_8_ = local_aa8;
      auVar35._8_8_ = uStack_ab0;
      auVar35._0_8_ = local_ab8;
      auVar34._8_8_ = uStack_ac0;
      auVar34._0_8_ = local_ac8;
      auVar33._8_8_ = uStack_ad0;
      auVar33._0_8_ = local_ad8;
      auVar28._8_8_ = uStack_b20;
      auVar28._0_8_ = local_b28;
      auVar27._8_8_ = uStack_b30;
      auVar27._0_8_ = local_b38;
      uVar90 = FStar_UInt64_eq_mask(uVar89,0xb);
      uVar104 = ~uVar90;
      uVar91 = FStar_UInt64_eq_mask(uVar89,0xc);
      uVar106 = ~uVar91;
      uVar92 = FStar_UInt64_eq_mask(uVar89,0xd);
      uVar107 = ~uVar92;
      uVar93 = FStar_UInt64_eq_mask(uVar89,0xe);
      uVar105 = ~uVar93;
      uVar89 = FStar_UInt64_eq_mask(uVar89,0xf);
      uVar98 = ~uVar89;
      auVar124._8_4_ = (int)uVar90;
      auVar124._0_8_ = uVar90;
      auVar124._12_4_ = (int)(uVar90 >> 0x20);
      auVar26._8_8_ = uStack_b40;
      auVar26._0_8_ = local_b48;
      auVar25._8_8_ = uStack_b50;
      auVar25._0_8_ = local_b58;
      auVar140._8_4_ = (int)uVar104;
      auVar140._0_8_ = uVar104;
      auVar140._12_4_ = (int)(uVar104 >> 0x20);
      auVar121._8_4_ = (int)uVar91;
      auVar121._0_8_ = uVar91;
      auVar121._12_4_ = (int)(uVar91 >> 0x20);
      auVar22._8_8_ = uStack_b80;
      auVar22._0_8_ = local_b88;
      auVar21._8_8_ = uStack_b90;
      auVar21._0_8_ = local_b98;
      auVar136._8_4_ = (int)uVar106;
      auVar136._0_8_ = uVar106;
      auVar136._12_4_ = (int)(uVar106 >> 0x20);
      auVar118._8_4_ = (int)uVar92;
      auVar118._0_8_ = uVar92;
      auVar118._12_4_ = (int)(uVar92 >> 0x20);
      auVar16._8_8_ = uStack_be0;
      auVar16._0_8_ = local_be8;
      auVar15._8_8_ = uStack_bf0;
      auVar15._0_8_ = local_bf8;
      auVar132._8_4_ = (int)uVar107;
      auVar132._0_8_ = uVar107;
      auVar132._12_4_ = (int)(uVar107 >> 0x20);
      auVar115._8_4_ = (int)uVar93;
      auVar115._0_8_ = uVar93;
      auVar115._12_4_ = (int)(uVar93 >> 0x20);
      auVar10._8_8_ = uStack_c40;
      auVar10._0_8_ = local_c48;
      auVar127._8_4_ = (int)uVar105;
      auVar127._0_8_ = uVar105;
      auVar127._12_4_ = (int)(uVar105 >> 0x20);
      auVar9._8_8_ = uStack_c50;
      auVar9._0_8_ = local_c58;
      auVar112._8_4_ = (int)uVar89;
      auVar112._0_8_ = uVar89;
      auVar112._12_4_ = (int)(uVar89 >> 0x20);
      auVar8._8_8_ = uStack_c60;
      auVar8._0_8_ = local_c68;
      auVar130._8_4_ = (int)uVar98;
      auVar130._0_8_ = uVar98;
      auVar130._12_4_ = (int)(uVar98 >> 0x20);
      local_d68 = ((((((((((((((auVar137 | auVar113 & auVar85) & auVar128 | auVar119 & auVar82) &
                              auVar125 | auVar116 & auVar80) & auVar122 | auVar110 & auVar70) &
                            auVar123 | auVar114 & auVar62) & auVar129 | auVar117 & auVar58) &
                          auVar135 | auVar120 & auVar52) & auVar139 | auVar126 & auVar46) & auVar142
                       | auVar40 & auVar131) & auVar144 | auVar32 & auVar111) & auVar140 |
                     auVar26 & auVar124) & auVar136 | auVar22 & auVar121) & auVar132 |
                   auVar16 & auVar118) & auVar127 | auVar10 & auVar115) & auVar130 |
                  auVar8 & auVar112;
      auVar7._8_8_ = uStack_c70;
      auVar7._0_8_ = local_c78;
      local_d78 = ((((((((((((((auVar133 | auVar113 & auVar86) & auVar128 | auVar119 & auVar81) &
                              auVar125 | auVar116 & auVar79) & auVar122 | auVar110 & auVar69) &
                            auVar123 | auVar114 & auVar61) & auVar129 | auVar117 & auVar57) &
                          auVar135 | auVar120 & auVar51) & auVar139 | auVar126 & auVar45) & auVar142
                       | auVar39 & auVar131) & auVar144 | auVar31 & auVar111) & auVar140 |
                     auVar25 & auVar124) & auVar136 | auVar21 & auVar121) & auVar132 |
                   auVar15 & auVar118) & auVar127 | auVar9 & auVar115) & auVar130 |
                  auVar7 & auVar112;
      auVar24._8_8_ = uStack_b60;
      auVar24._0_8_ = local_b68;
      auVar23._8_8_ = uStack_b70;
      auVar23._0_8_ = local_b78;
      auVar20._8_8_ = uStack_ba0;
      auVar20._0_8_ = local_ba8;
      auVar19._8_8_ = uStack_bb0;
      auVar19._0_8_ = local_bb8;
      auVar14._8_8_ = uStack_c00;
      auVar14._0_8_ = local_c08;
      auVar13._8_8_ = uStack_c10;
      auVar13._0_8_ = local_c18;
      auVar6._8_8_ = uStack_c80;
      auVar6._0_8_ = local_c88;
      auVar5._8_8_ = uStack_c90;
      auVar5._0_8_ = local_c98;
      auVar4._8_8_ = uStack_ca0;
      auVar4._0_8_ = local_ca8;
      local_d48 = ((((((((((((((auVar138 | auVar113 & auVar83) & auVar128 | auVar119 & auVar78) &
                              auVar125 | auVar116 & auVar76) & auVar122 | auVar110 & auVar68) &
                            auVar123 | auVar114 & auVar60) & auVar129 | auVar117 & auVar56) &
                          auVar135 | auVar120 & auVar50) & auVar139 | auVar44 & auVar126) & auVar142
                       | auVar38 & auVar131) & auVar144 | auVar30 & auVar111) & auVar140 |
                     auVar24 & auVar124) & auVar136 | auVar20 & auVar121) & auVar132 |
                   auVar14 & auVar118) & auVar127 | auVar6 & auVar115) & auVar130 |
                  auVar4 & auVar112;
      auVar3._8_8_ = uStack_cb0;
      auVar3._0_8_ = local_cb8;
      local_d58 = ((((((((((((((auVar141 | auVar113 & auVar84) & auVar128 | auVar119 & auVar77) &
                              auVar125 | auVar116 & auVar75) & auVar122 | auVar110 & auVar67) &
                            auVar123 | auVar114 & auVar59) & auVar129 | auVar117 & auVar55) &
                          auVar135 | auVar120 & auVar49) & auVar139 | auVar43 & auVar126) & auVar142
                       | auVar37 & auVar131) & auVar144 | auVar29 & auVar111) & auVar140 |
                     auVar23 & auVar124) & auVar136 | auVar19 & auVar121) & auVar132 |
                   auVar13 & auVar118) & auVar127 | auVar5 & auVar115) & auVar130 |
                  auVar3 & auVar112;
      auVar18._8_8_ = uStack_bc0;
      auVar18._0_8_ = local_bc8;
      auVar17._8_8_ = uStack_bd0;
      auVar17._0_8_ = local_bd8;
      auVar12._8_8_ = uStack_c20;
      auVar12._0_8_ = local_c28;
      auVar11._8_8_ = uStack_c30;
      auVar11._0_8_ = local_c38;
      auVar2._8_8_ = uStack_cc0;
      auVar2._0_8_ = local_cc8;
      auVar1._8_8_ = uStack_cd0;
      auVar1._0_8_ = local_cd8;
      auVar141._8_8_ = uStack_ce0;
      auVar141._0_8_ = local_ce8;
      auVar138._8_8_ = uStack_cf0;
      auVar138._0_8_ = local_cf8;
      auVar137._8_8_ = uStack_d00;
      auVar137._0_8_ = local_d08;
      local_d28 = ((((((((((((((auVar134 | auVar113 & auVar74) & auVar128 | auVar119 & auVar72) &
                              auVar125 | auVar116 & auVar66) & auVar122 | auVar110 & auVar64) &
                            auVar123 | auVar114 & auVar54) & auVar129 | auVar117 & auVar48) &
                          auVar135 | auVar120 & auVar42) & auVar139 | auVar36 & auVar126) & auVar142
                       | auVar34 & auVar131) & auVar144 | auVar28 & auVar111) & auVar140 |
                     auVar18 & auVar124) & auVar136 | auVar12 & auVar121) & auVar132 |
                   auVar2 & auVar118) & auVar127 | auVar141 & auVar115) & auVar130 |
                  auVar137 & auVar112;
      auVar133._8_8_ = uStack_d10;
      auVar133._0_8_ = local_d18;
      local_d38 = ((((((((((((((auVar143 | auVar113 & auVar73) & auVar128 | auVar119 & auVar71) &
                              auVar125 | auVar116 & auVar65) & auVar122 | auVar110 & auVar63) &
                            auVar123 | auVar114 & auVar53) & auVar129 | auVar117 & auVar47) &
                          auVar135 | auVar120 & auVar41) & auVar139 | auVar126 & auVar35) & auVar142
                       | auVar131 & auVar33) & auVar144 | auVar111 & auVar27) & auVar140 |
                     auVar124 & auVar17) & auVar136 | auVar121 & auVar11) & auVar132 |
                   auVar118 & auVar1) & auVar127 | auVar115 & auVar138) & auVar130 |
                  auVar112 & auVar133;
      point_add((uint64_t *)local_778,(uint64_t *)local_778,(uint64_t *)local_d78);
    }
    point_store(shared_secret,(uint64_t *)local_778);
  }
  return _Var87 && uVar88 == 0xffffffffffffffff;
}

Assistant:

bool
Hacl_Impl_P256_DH_ecp256dh_r(
  uint8_t *shared_secret,
  uint8_t *their_pubkey,
  uint8_t *private_key
)
{
  uint64_t tmp[16U] = { 0U };
  uint64_t *sk = tmp;
  uint64_t *pk = tmp + 4U;
  bool is_pk_valid = load_point_vartime(pk, their_pubkey);
  bn_from_bytes_be4(sk, private_key);
  uint64_t is_b_valid = bn_is_lt_order_and_gt_zero_mask4(sk);
  uint64_t oneq[4U] = { 0U };
  oneq[0U] = 1ULL;
  oneq[1U] = 0ULL;
  oneq[2U] = 0ULL;
  oneq[3U] = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t *os = sk;
    uint64_t uu____0 = oneq[i];
    uint64_t x = uu____0 ^ (is_b_valid & (sk[i] ^ uu____0));
    os[i] = x;);
  uint64_t is_sk_valid = is_b_valid;
  uint64_t ss_proj[12U] = { 0U };
  if (is_pk_valid)
  {
    point_mul(ss_proj, sk, pk);
    point_store(shared_secret, ss_proj);
  }
  return is_sk_valid == 0xFFFFFFFFFFFFFFFFULL && is_pk_valid;
}